

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

bool __thiscall Clasp::OutputTable::add(OutputTable *this,NameType *n,Literal c,uint32 u)

{
  bool bVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  PredType *in_RDI;
  PredType p;
  ConstString *in_stack_ffffffffffffffa8;
  OutputTable *in_stack_ffffffffffffffc0;
  ConstString local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_1c;
  undefined4 local_8;
  byte local_1;
  
  local_1c = in_ECX;
  local_8 = in_EDX;
  bVar1 = filter(in_stack_ffffffffffffffc0,&in_RDI->name);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    ConstString::ConstString(&local_30,in_stack_ffffffffffffffa8);
    local_28 = local_8;
    local_24 = local_1c;
    bk_lib::pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
    ::push_back((pod_vector<Clasp::OutputTable::PredType,_std::allocator<Clasp::OutputTable::PredType>_>
                 *)in_stack_ffffffffffffffc0,in_RDI);
    local_1 = 1;
    PredType::~PredType((PredType *)0x1d3306);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OutputTable::add(const NameType& n, Literal c, uint32 u) {
	if (!filter(n)) {
		PredType p = {n, c, u};
		preds_.push_back(p);
		return true;
	}
	return false;
}